

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qstringmatcher.cpp
# Opt level: O0

QString * __thiscall QStringMatcher::pattern(QStringMatcher *this)

{
  bool bVar1;
  QStringView *in_RDI;
  QStringView *this_00;
  
  this_00 = in_RDI;
  bVar1 = QString::isEmpty((QString *)0x502bc1);
  if (bVar1) {
    QStringView::toString(this_00);
  }
  else {
    QString::QString((QString *)this_00,(QString *)in_RDI);
  }
  return (QString *)this_00;
}

Assistant:

QString QStringMatcher::pattern() const
{
    if (!q_pattern.isEmpty())
        return q_pattern;
    return q_sv.toString();
}